

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Own<kj::AsyncIoProvider,_std::nullptr_t> __thiscall
kj::newAsyncIoProvider(kj *this,LowLevelAsyncIoProvider *lowLevel)

{
  AsyncIoProviderImpl *this_00;
  AsyncIoProvider *extraout_RDX;
  Own<kj::AsyncIoProvider,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,_std::nullptr_t> local_28;
  
  this_00 = (AsyncIoProviderImpl *)operator_new(0x78);
  anon_unknown_0::AsyncIoProviderImpl::AsyncIoProviderImpl(this_00,lowLevel);
  local_28.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::instance;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::instance;
  *(AsyncIoProviderImpl **)(this + 8) = this_00;
  local_28.ptr = (AsyncIoProviderImpl *)0x0;
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<AsyncIoProvider> newAsyncIoProvider(LowLevelAsyncIoProvider& lowLevel) {
  return kj::heap<AsyncIoProviderImpl>(lowLevel);
}